

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O1

int translate_srcfiles_to_srcfiles2(char **srcfiles,Dwarf_Signed srcfiles_count,char **srcfiles2)

{
  char *__s;
  size_t inlen;
  char *out;
  long lVar1;
  
  if (0 < srcfiles_count) {
    lVar1 = 0;
    do {
      __s = srcfiles[lVar1];
      inlen = strlen(__s);
      out = (char *)calloc(1,inlen + 1);
      if (out == (char *)0x0) {
        return 1;
      }
      _dwarf_safe_strcpy(out,inlen + 1,__s,inlen);
      srcfiles2[lVar1] = out;
      lVar1 = lVar1 + 1;
    } while (srcfiles_count != lVar1);
  }
  return 0;
}

Assistant:

static int
translate_srcfiles_to_srcfiles2(char **srcfiles,
    Dwarf_Signed srcfiles_count,
    char **srcfiles2)
{
    Dwarf_Signed i = 0;

    for (i = 0; i < srcfiles_count; ++i) {
        char * ostr = 0;
        char * newstr = 0;
        size_t slen = 0;

        ostr = srcfiles[i];
        slen = strlen(ostr);
        newstr =  calloc(1,slen+1);
        if (!newstr) {
            return DW_DLV_ERROR;
        }
        _dwarf_safe_strcpy(newstr,slen+1,ostr,slen);
        srcfiles2[i] = newstr;
    }
    return DW_DLV_OK;
}